

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O1

void rw::wdgl::printPipeinfo(Atomic *a)

{
  Geometry *pGVar1;
  InstanceDataHeader *pIVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  
  pGVar1 = a->geometry;
  pIVar2 = pGVar1->instData;
  if ((pIVar2 != (InstanceDataHeader *)0x0) && (pIVar2->platform == 0xb)) {
    if (a->pipeline == (ObjPipeline *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (ulong)(a->pipeline->super_Pipeline).pluginID;
    }
    printf("%s %x: ",debugFile,uVar3);
    pIVar2 = pGVar1->instData;
    if (0 < (int)pIVar2[1].platform) {
      lVar5 = 4;
      lVar4 = 0;
      do {
        printf("%x(%x) ",(ulong)*(uint *)(*(long *)(pIVar2 + 2) + -4 + lVar5),
               (ulong)*(uint *)(*(long *)(pIVar2 + 2) + lVar5));
        lVar4 = lVar4 + 1;
        lVar5 = lVar5 + 0x18;
      } while (lVar4 < (int)pIVar2[1].platform);
    }
    putchar(10);
    return;
  }
  return;
}

Assistant:

void
printPipeinfo(Atomic *a)
{
	Geometry *g = a->geometry;
	if(g->instData == nil || g->instData->platform != PLATFORM_WDGL)
		return;
	int32 plgid = 0;
	if(a->pipeline)
		plgid = a->pipeline->pluginID;
	printf("%s %x: ", debugFile, plgid);
	InstanceDataHeader *h = (InstanceDataHeader*)g->instData;
	for(int i = 0; i < h->numAttribs; i++)
		printf("%x(%x) ", h->attribs[i].index, h->attribs[i].type);
	printf("\n");
}